

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall Manifold_InvalidInput1_Test::TestBody(Manifold_InvalidInput1_Test *this)

{
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_188;
  Message local_180;
  Error local_178;
  Error local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_;
  Manifold local_108 [8];
  Manifold tet;
  undefined1 local_f8 [8];
  MeshGL in;
  Manifold_InvalidInput1_Test *this_local;
  
  in._224_8_ = this;
  TetGL();
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)&in,7);
  *pvVar3 = NAN;
  manifold::Manifold::Manifold(local_108,(MeshGLP *)local_f8);
  bVar1 = manifold::Manifold::IsEmpty();
  local_129 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_128,(AssertionResult *)"tet.IsEmpty()"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x6e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_174 = manifold::Manifold::Status();
  local_178 = NonFiniteVertex;
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_170,"tet.Status()","Manifold::Error::NonFiniteVertex",&local_174,
             &local_178);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_180);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x6f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  manifold::Manifold::~Manifold(local_108);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)local_f8);
  return;
}

Assistant:

TEST(Manifold, InvalidInput1) {
  MeshGL in = TetGL();
  in.vertProperties[2 * 3 + 1] = NAN;
  Manifold tet(in);
  EXPECT_TRUE(tet.IsEmpty());
  EXPECT_EQ(tet.Status(), Manifold::Error::NonFiniteVertex);
}